

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_block_is_null(char *p)

{
  uint local_1c;
  char *pcStack_18;
  uint i;
  char *p_local;
  
  local_1c = 0;
  pcStack_18 = p;
  while( true ) {
    if (0x1ff < local_1c) {
      return L'\x01';
    }
    if (*pcStack_18 != '\0') break;
    local_1c = local_1c + 1;
    pcStack_18 = pcStack_18 + 1;
  }
  return L'\0';
}

Assistant:

static int
archive_block_is_null(const char *p)
{
	unsigned i;

	for (i = 0; i < 512; i++)
		if (*p++)
			return (0);
	return (1);
}